

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::addUniform
          (UniformCollection *this,Uniform *uniform)

{
  Uniform *uniform_local;
  UniformCollection *this_local;
  
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
  ::push_back(&this->m_uniforms,uniform);
  return;
}

Assistant:

void				addUniform			(const Uniform& uniform)		{ m_uniforms.push_back(uniform);	}